

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

Config * __thiscall Catch::Session::config(Session *this)

{
  bool bVar1;
  Config *pCVar2;
  Session *this_local;
  
  bVar1 = Ptr<Catch::Config>::operator!(&this->m_config);
  if (bVar1) {
    pCVar2 = (Config *)operator_new(0x200);
    Config::Config(pCVar2,&this->m_configData);
    Ptr<Catch::Config>::operator=(&this->m_config,pCVar2);
  }
  pCVar2 = Ptr<Catch::Config>::operator*(&this->m_config);
  return pCVar2;
}

Assistant:

Config& config() {
            if( !m_config )
                m_config = new Config( m_configData );
            return *m_config;
        }